

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

void __thiscall Fossilize::FeatureFilter::FeatureFilter(FeatureFilter *this)

{
  Impl *pIVar1;
  
  pIVar1 = (Impl *)operator_new(0x1460);
  (pIVar1->enabled_extensions)._M_h._M_buckets = &(pIVar1->enabled_extensions)._M_h._M_single_bucket
  ;
  (pIVar1->enabled_extensions)._M_h._M_bucket_count = 1;
  (pIVar1->enabled_extensions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->enabled_extensions)._M_h._M_element_count = 0;
  (pIVar1->enabled_extensions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->props2).sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pIVar1->null_device = false;
  (pIVar1->module_to_info_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar1->module_to_info_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pIVar1->module_to_info_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (pIVar1->module_to_info_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar1->module_to_info_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (pIVar1->enabled_extensions)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->enabled_extensions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(pIVar1->enabled_extensions)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)((long)&pIVar1->query + 4) = 0;
  memset(&(pIVar1->props2).pNext,0,0x344);
  memset(&(pIVar1->features2).pNext,0,0xe4);
  memset(&pIVar1->features,0,0xba4);
  memset(&pIVar1->props,0,0x3cc);
  (pIVar1->module_to_info)._M_h._M_buckets = &(pIVar1->module_to_info)._M_h._M_single_bucket;
  (pIVar1->module_to_info)._M_h._M_bucket_count = 1;
  (pIVar1->module_to_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->module_to_info)._M_h._M_element_count = 0;
  (pIVar1->module_to_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->module_to_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->module_to_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->impl = pIVar1;
  return;
}

Assistant:

FeatureFilter::FeatureFilter()
{
	impl = new Impl;
}